

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O2

int mcpl2phits_parse_args
              (int argc,char **argv,char **inmcplfile,char **outphitsfile,uint64_t *nparticles_limit
              ,int *use64bitreclen,int *nopolarisation)

{
  uint64_t uVar1;
  int iVar2;
  size_t sVar3;
  char **ppcVar4;
  ulong uVar5;
  char cVar6;
  uint64_t *puVar7;
  int *piVar8;
  char *pcVar9;
  long lVar10;
  uint64_t local_48;
  uint64_t *local_40;
  int *local_38;
  
  *inmcplfile = (char *)0x0;
  *outphitsfile = (char *)0x0;
  *nparticles_limit = 0xffffffffffffffff;
  *use64bitreclen = 0;
  *nopolarisation = 0;
  local_48 = 0xffffffffffffffff;
  lVar10 = 1;
  local_40 = nparticles_limit;
  local_38 = use64bitreclen;
  do {
    if (argc <= lVar10) {
      if (*inmcplfile == (char *)0x0) {
        pcVar9 = "Missing argument : input MCPL file";
LAB_00103494:
        iVar2 = mcpl2phits_app_usage(argv,pcVar9);
      }
      else {
        if (*outphitsfile == (char *)0x0) {
          *outphitsfile = "phits.dmp";
        }
        iVar2 = 0;
        if ((long)local_48 < 1) {
          local_48 = 0;
        }
        *local_40 = local_48;
      }
      return iVar2;
    }
    pcVar9 = argv[lVar10];
    sVar3 = strlen(pcVar9);
    if (sVar3 != 0) {
      if (sVar3 == 1) {
        cVar6 = *pcVar9;
      }
      else {
        cVar6 = *pcVar9;
        if ((cVar6 == '-') && (pcVar9[1] != '-')) {
          puVar7 = (uint64_t *)0x0;
          for (uVar5 = 1; uVar5 < sVar3; uVar5 = uVar5 + 1) {
            if (puVar7 == (uint64_t *)0x0) {
              switch(pcVar9[uVar5]) {
              case 'f':
                piVar8 = local_38;
                break;
              default:
                pcVar9 = "Unrecognised option";
                goto LAB_00103494;
              case 'h':
                goto switchD_001033e8_caseD_68;
              case 'l':
                local_48 = 0;
                puVar7 = &local_48;
                if ((2 - sVar3) + uVar5 != 1) goto LAB_00103418;
                pcVar9 = "Bad option: missing number";
                goto LAB_00103494;
              case 'n':
                piVar8 = nopolarisation;
              }
              *piVar8 = 1;
              puVar7 = (uint64_t *)0x0;
            }
            else {
              if ((byte)(pcVar9[uVar5] - 0x3aU) < 0xf6) {
                pcVar9 = "Bad option: expected number";
                goto LAB_00103494;
              }
              uVar1 = *puVar7;
              *puVar7 = uVar1 * 10;
              *puVar7 = (uVar1 * 10 + (long)pcVar9[uVar5]) - 0x30;
            }
LAB_00103418:
          }
          goto LAB_00103388;
        }
        if ((sVar3 == 6) && (iVar2 = strcmp(pcVar9,"--help"), iVar2 == 0)) {
switchD_001033e8_caseD_68:
          mcpl2phits_app_usage(argv,(char *)0x0);
          return -1;
        }
      }
      if (cVar6 == '-') {
        pcVar9 = "Bad arguments";
        goto LAB_00103494;
      }
      if (*outphitsfile != (char *)0x0) {
        pcVar9 = "Too many arguments.";
        goto LAB_00103494;
      }
      ppcVar4 = outphitsfile;
      if (*inmcplfile == (char *)0x0) {
        ppcVar4 = inmcplfile;
      }
      *ppcVar4 = pcVar9;
    }
LAB_00103388:
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

int mcpl2phits_parse_args( int argc,const char **argv, const char** inmcplfile,
                           const char **outphitsfile, uint64_t* nparticles_limit,
                           int* use64bitreclen, int* nopolarisation ) {
  //returns: 0 all ok, 1: error, -1: all ok but do nothing (-h/--help mode)
  *inmcplfile = 0;
  *outphitsfile = 0;
  *nparticles_limit = UINT64_MAX;
  *use64bitreclen = 0;
  *nopolarisation = 0;

  int64_t opt_num_limit = -1;
  int i;
  for (i = 1; i<argc; ++i) {
    const char * a = argv[i];
    size_t n = strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = 0;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9')
            return mcpl2phits_app_usage(argv,"Bad option: expected number");
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        switch(a[j]) {
        case 'h': mcpl2phits_app_usage(argv,0); return -1;
        case 'l': consume_digit = &opt_num_limit; break;
        case 'f': *use64bitreclen = 1; break;
        case 'n': *nopolarisation = 1; break;
        default:
          return mcpl2phits_app_usage(argv,"Unrecognised option");
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n)
            return mcpl2phits_app_usage(argv,"Bad option: missing number");
        }
      }

    } else if (n==6 && strcmp(a,"--help")==0) {
      mcpl2phits_app_usage(argv,0);
      return -1;
    } else if (n>=1&&a[0]!='-') {
      if (*outphitsfile)
        return mcpl2phits_app_usage(argv,"Too many arguments.");
      else if (*inmcplfile) *outphitsfile = a;
      else *inmcplfile = a;
    } else {
      return mcpl2phits_app_usage(argv,"Bad arguments");
    }
  }

  if (!*inmcplfile)
    return mcpl2phits_app_usage(argv,"Missing argument : input MCPL file");
  if (!*outphitsfile)
    *outphitsfile = "phits.dmp";

  if (opt_num_limit<=0)
    opt_num_limit = 0;

  //NB: For now we allow unlimited number of particles in the file - but let the
  //mcpl2phits method emit a WARNING if exceeding INT32_MAX particles.
  *nparticles_limit = opt_num_limit;

  return 0;
}